

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlmodule.c
# Opt level: O0

int xmlModuleClose(xmlModulePtr module)

{
  int iVar1;
  int rc;
  xmlModulePtr module_local;
  
  if (module == (xmlModulePtr)0x0) {
    module_local._4_4_ = -1;
  }
  else {
    iVar1 = xmlModulePlatformClose(module->handle);
    if (iVar1 == 0) {
      module_local._4_4_ = xmlModuleFree(module);
    }
    else {
      module_local._4_4_ = -2;
    }
  }
  return module_local._4_4_;
}

Assistant:

int
xmlModuleClose(xmlModulePtr module)
{
    int rc;

    if (NULL == module)
        return -1;

    rc = xmlModulePlatformClose(module->handle);

    if (rc != 0)
        return -2;

    rc = xmlModuleFree(module);
    return (rc);
}